

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::DoSimdLoadSplat<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  RunResult RVar1;
  RunResult RVar2;
  Value value;
  byte local_9;
  
  RVar1 = Load<unsigned_char>(this,instr,&local_9,out_trap);
  RVar2 = Trap;
  if (RVar1 == Ok) {
    value.field_0._8_8_ = (ulong)local_9 * 0x101010101010101;
    value.field_0.i64_ = value.field_0._8_8_;
    Push(this,value);
    RVar2 = Ok;
  }
  return RVar2;
}

Assistant:

RunResult Thread::DoSimdLoadSplat(Instr instr, Trap::Ptr* out_trap) {
  using L = typename S::LaneType;
  L val;
  if (Load<L>(instr, &val, out_trap) != RunResult::Ok) {
    return RunResult::Trap;
  }
  S result;
  std::fill(std::begin(result.v), std::end(result.v), val);
  Push(result);
  return RunResult::Ok;
}